

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

char * cimg_library::cimg::imagemagick_path(char *user_path,bool reinit_path)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  FILE *file;
  bool path_found;
  bool reinit_path_local;
  char *user_path_local;
  
  if ((imagemagick_path(char_const*,bool)::s_path == '\0') &&
     (iVar1 = __cxa_guard_acquire(&imagemagick_path(char_const*,bool)::s_path), iVar1 != 0)) {
    CImg<char>::CImg(&imagemagick_path::s_path);
    __cxa_atexit(CImg<char>::~CImg,&imagemagick_path::s_path,&__dso_handle);
    __cxa_guard_release(&imagemagick_path(char_const*,bool)::s_path);
  }
  mutex(7,1);
  if (reinit_path) {
    CImg<char>::assign(&imagemagick_path::s_path);
  }
  if (user_path == (char *)0x0) {
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
    if (pcVar2 == (char *)0x0) {
      CImg<char>::assign(&imagemagick_path::s_path,0x400,1,1,1);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
      strcpy(pcVar2,"./magick");
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
      pFVar3 = (FILE *)std_fopen(pcVar2,"r");
      file._3_1_ = pFVar3 != (FILE *)0x0;
      if (file._3_1_) {
        fclose(pFVar3);
      }
      else {
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
        strcpy(pcVar2,"./convert");
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
        pFVar3 = (FILE *)std_fopen(pcVar2,"r");
        if (pFVar3 != (FILE *)0x0) {
          fclose(pFVar3);
        }
        file._3_1_ = pFVar3 != (FILE *)0x0 || file._3_1_;
      }
      if (!file._3_1_) {
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
        strcpy(pcVar2,"convert");
      }
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
      winformat_string(pcVar2);
    }
  }
  else {
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
    if (pcVar2 == (char *)0x0) {
      CImg<char>::assign(&imagemagick_path::s_path,0x400,1,1,1);
    }
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
    strncpy(pcVar2,user_path,0x3ff);
  }
  mutex(7,0);
  pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&imagemagick_path::s_path);
  return pcVar2;
}

Assistant:

inline const char* imagemagick_path(const char *const user_path, const bool reinit_path) {
      static CImg<char> s_path;
      cimg::mutex(7);
      if (reinit_path) s_path.assign();
      if (user_path) {
        if (!s_path) s_path.assign(1024);
        std::strncpy(s_path,user_path,1023);
      } else if (!s_path) {
        s_path.assign(1024);
        bool path_found = false;
        std::FILE *file = 0;
#if cimg_OS==2
        const char *const pf_path = programfiles_path();
        for (int l = 0; l<2 && !path_found; ++l) {
          const char *const s_exe = l?"convert":"magick";
          cimg_snprintf(s_path,s_path._width,".\\%s.exe",s_exe);
          if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          for (int k = 32; k>=10 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%.2d-\\%s.exe",pf_path,k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 9; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%d-Q\\%s.exe",pf_path,k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%d\\%s.exe",pf_path,k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=10 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%.2d-\\VISUA~1\\BIN\\%s.exe",pf_path,k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 9; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%d-Q\\VISUA~1\\BIN\\%s.exe",pf_path,k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%d\\VISUA~1\\BIN\\%s.exe",pf_path,k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=10 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%.2d-\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 9; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%d-Q\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%d\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=10 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%.2d-\\VISUA~1\\BIN\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 9; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%d-Q\\VISUA~1\\BIN\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%d\\VISUA~1\\BIN\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=10 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%.2d-\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 9; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%d-Q\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%d\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=10 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%.2d-\\VISUA~1\\BIN\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 9; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%d-Q\\VISUA~1\\BIN\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          for (int k = 32; k>=0 && !path_found; --k) {
            cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%d\\VISUA~1\\BIN\\%s.exe",k,s_exe);
            if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
          }
          if (!path_found) cimg_snprintf(s_path,s_path._width,"%s.exe",s_exe);
        }
#else
        std::strcpy(s_path,"./magick");
        if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        if (!path_found) {
          std::strcpy(s_path,"./convert");
          if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(s_path,"convert");
#endif
        winformat_string(s_path);
      }
      cimg::mutex(7,0);
      return s_path;
    }